

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfdcapi_elements_address.cpp
# Opt level: O0

void __thiscall
cfdcapi_elements_address_GetPegoutAddress_Test::TestBody
          (cfdcapi_elements_address_GetPegoutAddress_Test *this)

{
  initializer_list<CfdCapiTestPegoutAddressData> __l;
  bool bVar1;
  undefined1 uVar2;
  char *pcVar3;
  char *in_R9;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  char *str_buffer;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  char *base_descriptor;
  char *mainchain_address;
  ScopedTrace gtest_trace_353;
  CfdCapiTestPegoutAddressData *test_data;
  iterator __end1;
  iterator __begin1;
  vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_> *__range1;
  vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_> test_case;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  int ret;
  void *handle;
  vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>
  *in_stack_fffffffffffffa68;
  AssertionResult *in_stack_fffffffffffffa70;
  CfdErrorCode *in_stack_fffffffffffffa78;
  vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>
  *in_stack_fffffffffffffa80;
  undefined4 in_stack_fffffffffffffa88;
  undefined4 in_stack_fffffffffffffa8c;
  undefined7 in_stack_fffffffffffffa98;
  undefined1 in_stack_fffffffffffffa9f;
  vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>
  *in_stack_fffffffffffffaa0;
  undefined7 in_stack_fffffffffffffaa8;
  undefined1 in_stack_fffffffffffffaaf;
  undefined4 in_stack_fffffffffffffab0;
  undefined4 in_stack_fffffffffffffab4;
  char *in_stack_fffffffffffffac8;
  int in_stack_fffffffffffffad4;
  char *in_stack_fffffffffffffad8;
  undefined4 in_stack_fffffffffffffae0;
  int in_stack_fffffffffffffae4;
  undefined7 in_stack_fffffffffffffb00;
  char *in_stack_fffffffffffffb08;
  AssertHelper local_4e0;
  Message local_4d8;
  undefined4 local_4cc;
  AssertionResult local_4c8;
  AssertHelper local_4b8;
  Message local_4b0;
  AssertionResult local_4a8;
  AssertHelper local_498;
  Message local_490;
  undefined4 local_484;
  AssertionResult local_480;
  char *local_470;
  AssertHelper local_468;
  Message local_460;
  AssertionResult local_458;
  AssertHelper local_448;
  Message local_440;
  AssertionResult local_438;
  AssertHelper local_428;
  Message local_420;
  undefined4 local_414;
  AssertionResult local_410;
  char *local_400;
  undefined1 local_3f8 [16];
  reference local_3e8;
  CfdCapiTestPegoutAddressData *local_3e0;
  __normal_iterator<CfdCapiTestPegoutAddressData_*,_std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>_>
  local_3d8;
  undefined1 *local_3d0;
  undefined1 local_3c0 [608];
  int in_stack_fffffffffffffea0;
  uint32_t in_stack_fffffffffffffea4;
  char *in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  int in_stack_fffffffffffffeb4;
  void *in_stack_fffffffffffffeb8;
  char **in_stack_fffffffffffffed0;
  char **in_stack_fffffffffffffed8;
  undefined1 local_b0 [24];
  string local_98;
  AssertHelper local_78;
  Message local_70;
  undefined1 local_61;
  AssertionResult local_60;
  AssertHelper local_50;
  Message local_48 [3];
  undefined4 local_2c;
  AssertionResult local_28;
  int local_14;
  long local_10;
  
  local_10 = 0;
  local_14 = CfdCreateHandle((void **)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88))
  ;
  local_2c = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
             (char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
             (int *)in_stack_fffffffffffffa70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_28);
  if (!bVar1) {
    testing::Message::Message(local_48);
    in_stack_fffffffffffffb08 =
         testing::AssertionResult::failure_message((AssertionResult *)0x341d9a);
    testing::internal::AssertHelper::AssertHelper
              (&local_50,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0xaf,in_stack_fffffffffffffb08);
    testing::internal::AssertHelper::operator=(&local_50,local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_50);
    testing::Message::~Message((Message *)0x341dfd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x341e52);
  local_61 = local_10 != 0;
  testing::AssertionResult::AssertionResult<bool>
            (in_stack_fffffffffffffa70,(bool *)in_stack_fffffffffffffa68,(type *)0x341e86);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(&local_60);
  if (!(bool)uVar2) {
    testing::Message::Message(&local_70);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_98,(internal *)&local_60,(AssertionResult *)"(NULL == handle)","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0xb0,pcVar3);
    testing::internal::AssertHelper::operator=(&local_78,&local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    testing::Message::~Message((Message *)0x341f82);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x341ffd);
  memcpy(local_3c0,&PTR_anon_var_dwarf_1472d6_00b5e950,0x300);
  std::allocator<CfdCapiTestPegoutAddressData>::allocator
            ((allocator<CfdCapiTestPegoutAddressData> *)0x34204f);
  __l._M_array._7_1_ = in_stack_fffffffffffffaaf;
  __l._M_array._0_7_ = in_stack_fffffffffffffaa8;
  __l._M_len._0_4_ = in_stack_fffffffffffffab0;
  __l._M_len._4_4_ = in_stack_fffffffffffffab4;
  std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>::vector
            (in_stack_fffffffffffffaa0,__l,
             (allocator_type *)CONCAT17(in_stack_fffffffffffffa9f,in_stack_fffffffffffffa98));
  std::allocator<CfdCapiTestPegoutAddressData>::~allocator
            ((allocator<CfdCapiTestPegoutAddressData> *)0x342083);
  local_3d0 = local_b0;
  local_3d8._M_current =
       (CfdCapiTestPegoutAddressData *)
       std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>::
       begin(in_stack_fffffffffffffa68);
  local_3e0 = (CfdCapiTestPegoutAddressData *)
              std::
              vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>::
              end(in_stack_fffffffffffffa68);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<CfdCapiTestPegoutAddressData_*,_std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>_>
                             *)in_stack_fffffffffffffa70,
                            (__normal_iterator<CfdCapiTestPegoutAddressData_*,_std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>_>
                             *)in_stack_fffffffffffffa68), bVar1) {
    local_3e8 = __gnu_cxx::
                __normal_iterator<CfdCapiTestPegoutAddressData_*,_std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>_>
                ::operator*(&local_3d8);
    testing::ScopedTrace::ScopedTrace
              ((ScopedTrace *)CONCAT44(in_stack_fffffffffffffae4,in_stack_fffffffffffffae0),
               in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffac8);
    local_3f8._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_400 = (char *)0x0;
    in_stack_fffffffffffffa70 = (AssertionResult *)&local_400;
    in_stack_fffffffffffffa68 =
         (vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_> *)
         local_3f8;
    in_stack_fffffffffffffae4 =
         CfdGetPegoutAddress(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,
                             in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                             in_stack_fffffffffffffea4,in_stack_fffffffffffffea0,
                             in_stack_fffffffffffffed0,in_stack_fffffffffffffed8);
    local_414 = 0;
    local_14 = in_stack_fffffffffffffae4;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (int *)in_stack_fffffffffffffa70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_410);
    in_stack_fffffffffffffae0 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffae0);
    if (!bVar1) {
      testing::Message::Message(&local_420);
      in_stack_fffffffffffffad8 =
           testing::AssertionResult::failure_message((AssertionResult *)0x34227c);
      testing::internal::AssertHelper::AssertHelper
                (&local_428,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x169,in_stack_fffffffffffffad8);
      testing::internal::AssertHelper::operator=(&local_428,&local_420);
      testing::internal::AssertHelper::~AssertHelper(&local_428);
      testing::Message::~Message((Message *)0x3422d9);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34232e);
    if (local_14 == 0) {
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_438,"test_data.exp_address","mainchain_address",
                 local_3e8->exp_address,(char *)local_3f8._0_8_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_438);
      in_stack_fffffffffffffad4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffffad4);
      if (!bVar1) {
        testing::Message::Message(&local_440);
        in_stack_fffffffffffffac8 =
             testing::AssertionResult::failure_message((AssertionResult *)0x3423d6);
        testing::internal::AssertHelper::AssertHelper
                  (&local_448,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x16b,in_stack_fffffffffffffac8);
        testing::internal::AssertHelper::operator=(&local_448,&local_440);
        testing::internal::AssertHelper::~AssertHelper(&local_448);
        testing::Message::~Message((Message *)0x342433);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x342488);
      testing::internal::CmpHelperSTREQ
                ((internal *)&local_458,"test_data.exp_base_descriptor","base_descriptor",
                 local_3e8->exp_base_descriptor,local_400);
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_458);
      if (!bVar1) {
        testing::Message::Message(&local_460);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x342522);
        testing::internal::AssertHelper::AssertHelper
                  (&local_468,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                   ,0x16c,pcVar3);
        testing::internal::AssertHelper::operator=(&local_468,&local_460);
        testing::internal::AssertHelper::~AssertHelper(&local_468);
        testing::Message::~Message((Message *)0x34257f);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x3425d4);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffa78);
      CfdFreeStringBuffer((char *)in_stack_fffffffffffffa78);
    }
    testing::ScopedTrace::~ScopedTrace((ScopedTrace *)(local_3f8 + 0xf));
    __gnu_cxx::
    __normal_iterator<CfdCapiTestPegoutAddressData_*,_std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>_>
    ::operator++(&local_3d8);
  }
  local_14 = CfdGetLastErrorCode((void *)CONCAT17(in_stack_fffffffffffffaaf,
                                                  in_stack_fffffffffffffaa8));
  if (local_14 != 0) {
    local_470 = (char *)0x0;
    local_14 = CfdGetLastErrorMessage
                         (in_stack_fffffffffffffb08,
                          (char **)CONCAT17(uVar2,in_stack_fffffffffffffb00));
    local_484 = 0;
    testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
              ((char *)CONCAT44(in_stack_fffffffffffffa8c,in_stack_fffffffffffffa88),
               (char *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78,
               (int *)in_stack_fffffffffffffa70);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_480);
    if (!bVar1) {
      testing::Message::Message(&local_490);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x342721);
      testing::internal::AssertHelper::AssertHelper
                (&local_498,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x176,pcVar3);
      testing::internal::AssertHelper::operator=(&local_498,&local_490);
      testing::internal::AssertHelper::~AssertHelper(&local_498);
      testing::Message::~Message((Message *)0x34277e);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x3427d3);
    testing::internal::CmpHelperSTREQ((internal *)&local_4a8,"\"\"","str_buffer","",local_470);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a8);
    if (!bVar1) {
      testing::Message::Message(&local_4b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x342868);
      testing::internal::AssertHelper::AssertHelper
                (&local_4b8,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
                 ,0x177,pcVar3);
      testing::internal::AssertHelper::operator=(&local_4b8,&local_4b0);
      testing::internal::AssertHelper::~AssertHelper(&local_4b8);
      testing::Message::~Message((Message *)0x3428c5);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x34291a);
    CfdFreeStringBuffer((char *)in_stack_fffffffffffffa78);
    local_470 = (char *)0x0;
  }
  local_14 = CfdFreeHandle(in_stack_fffffffffffffa78);
  local_4cc = 0;
  testing::internal::EqHelper<false>::Compare<CfdErrorCode,int>
            ((char *)CONCAT44(local_14,in_stack_fffffffffffffa88),(char *)in_stack_fffffffffffffa80,
             in_stack_fffffffffffffa78,(int *)in_stack_fffffffffffffa70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4c8);
  if (!bVar1) {
    testing::Message::Message(&local_4d8);
    in_stack_fffffffffffffa80 =
         (vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x3429f6);
    testing::internal::AssertHelper::AssertHelper
              (&local_4e0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd/test/capi/test_cfdcapi_elements_address.cpp"
               ,0x17d,(char *)in_stack_fffffffffffffa80);
    testing::internal::AssertHelper::operator=(&local_4e0,&local_4d8);
    testing::internal::AssertHelper::~AssertHelper(&local_4e0);
    testing::Message::~Message((Message *)0x342a53);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x342aa8);
  std::vector<CfdCapiTestPegoutAddressData,_std::allocator<CfdCapiTestPegoutAddressData>_>::~vector
            (in_stack_fffffffffffffa80);
  return;
}

Assistant:

TEST(cfdcapi_elements_address, GetPegoutAddress) {
  void* handle = NULL;
  int ret = CfdCreateHandle(&handle);
  EXPECT_EQ(kCfdSuccess, ret);
  EXPECT_FALSE((NULL == handle));

  struct CfdCapiTestPegoutAddressData {
    const char* name;
    const char* descriptor;
    uint32_t counter;
    int mainchain_net_type;
    int elements_net_type;
    int address_type;
    const char* exp_address;
    const char* exp_base_descriptor;
  };

  std::vector<CfdCapiTestPegoutAddressData> test_case = {
    {
      "extkey - p2pkh - regtest",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "n3Na7mek1zAStRxvt7RPrNCpZhDErMPkGw",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "descriptor - p2pkh - regtest",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "n3Na7mek1zAStRxvt7RPrNCpZhDErMPkGw",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2pkh - regtest",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "n3Na7mek1zAStRxvt7RPrNCpZhDErMPkGw",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "extkey - p2pkh - mainnet",
      "xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2",
      0,
      kCfdNetworkMainnet,
      kCfdNetworkLiquidv1,
      kCfdP2pkhAddress,
      "1MMxsm4QG8NRHqaFZaUTFQQ9c9dEHUPWnD",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)"
    },
    {
      "descriptor - p2pkh - mainnet",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)",
      0,
      kCfdNetworkMainnet,
      kCfdNetworkLiquidv1,
      kCfdP2pkhAddress,
      "1MMxsm4QG8NRHqaFZaUTFQQ9c9dEHUPWnD",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)"
    },
    {
      "deriveDescriptor - p2pkh - mainnet",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2/0/*)",
      0,
      kCfdNetworkMainnet,
      kCfdNetworkLiquidv1,
      kCfdP2pkhAddress,
      "1MMxsm4QG8NRHqaFZaUTFQQ9c9dEHUPWnD",
      "pkh(xpub67v4wfueMiZVkc7UbutFgPiptQw4kkNs89ooNMrwht8xEjnZZim1rNZHhEdrLejB99fiBdnWNNAB8hmUK7tCo5Ua6UtHzwVLj2Bzpch7vB2)"
    },
    {
      "extkey - p2wpkh - regtest",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2wpkhAddress,
      "bcrt1qa77w63m523kq82z4fn3d5f7qxqxfm4pmdthkdf",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "descriptor - p2wpkh - regtest",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2wpkhAddress,
      "bcrt1qa77w63m523kq82z4fn3d5f7qxqxfm4pmdthkdf",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2wpkh - regtest",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2wpkhAddress,
      "bcrt1qa77w63m523kq82z4fn3d5f7qxqxfm4pmdthkdf",
      "wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "extkey - p2sh-p2wpkh - regtest",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2shP2wpkhAddress,
      "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))"
    },
    {
      "descriptor - p2sh-p2wpkh - regtest",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2shP2wpkhAddress,
      "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))"
    },
    {
      "deriveDescriptor - p2sh-p2wpkh - regtest",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*))",
      0,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2shP2wpkhAddress,
      "2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo",
      "sh(wpkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y))"
    },
    {
      "extkey - p2pkh - regtest - count 1",
      "tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y",
      1,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mjii5Qey7jLxtvsV5f6BaFeVaqfeqcKXzL",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "descriptor - p2pkh - regtest - count 1",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)",
      1,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mjii5Qey7jLxtvsV5f6BaFeVaqfeqcKXzL",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2pkh - regtest - count 1",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      1,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mjii5Qey7jLxtvsV5f6BaFeVaqfeqcKXzL",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
    {
      "deriveDescriptor - p2pkh - regtest - count max",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y/0/*)",
      0x7fffffff,
      kCfdNetworkRegtest,
      kCfdNetworkElementsRegtest,
      kCfdP2pkhAddress,
      "mfkLVoxUp9K2Q1KeRr3Ewnn414jLSCTGmn",
      "pkh(tpubDASgDECJvTMzUgS7GkSCxQAAWPveW7BeTPSvbi1wpUe1Mq1v743FRw1i7vTavjAb3D3Y8geCTYw2ezgiVS7SFXDXS6NpZmvr6XPjPvg632y)"
    },
  };

  for (const auto& test_data : test_case) {
    SCOPED_TRACE(test_data.name);

    char* mainchain_address = nullptr;
    char* base_descriptor = nullptr;
    ret = CfdGetPegoutAddress(
        handle, test_data.mainchain_net_type, test_data.elements_net_type,
        test_data.descriptor, test_data.counter, test_data.address_type,
        &mainchain_address, &base_descriptor);
    EXPECT_EQ(kCfdSuccess, ret);
    if (ret == kCfdSuccess) {
      EXPECT_STREQ(test_data.exp_address, mainchain_address);
      EXPECT_STREQ(test_data.exp_base_descriptor, base_descriptor);
      CfdFreeStringBuffer(mainchain_address);
      CfdFreeStringBuffer(base_descriptor);
    }
  }

  ret = CfdGetLastErrorCode(handle);
  if (ret != kCfdSuccess) {
    char* str_buffer = NULL;
    ret = CfdGetLastErrorMessage(handle, &str_buffer);
    EXPECT_EQ(kCfdSuccess, ret);
    EXPECT_STREQ("", str_buffer);
    CfdFreeStringBuffer(str_buffer);
    str_buffer = NULL;
  }

  ret = CfdFreeHandle(handle);
  EXPECT_EQ(kCfdSuccess, ret);
}